

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O1

gnode_t * gnode_loop_stat_create
                    (gtoken_s token,gnode_t *cond,gnode_t *stmt,gnode_t *expr,gnode_t *decl,
                    uint32_t block_length)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x68);
  pgVar1->tag = NODE_LOOP_STAT;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  pgVar1->block_length = block_length;
  *(gnode_t **)(pgVar1 + 1) = cond;
  *(gnode_t **)&pgVar1[1].block_length = stmt;
  *(gnode_t **)&pgVar1[1].token = expr;
  pgVar1[1].token.colno = 0xffffffff;
  return pgVar1;
}

Assistant:

gnode_t *gnode_loop_stat_create (gtoken_s token, gnode_t *cond, gnode_t *stmt, gnode_t *expr, gnode_t *decl, uint32_t block_length) {
    gnode_loop_stmt_t *node = (gnode_loop_stmt_t *)mem_alloc(NULL, sizeof(gnode_loop_stmt_t));

    SETBASE(node, NODE_LOOP_STAT, token);
    SETDECL(node, decl);
    node->base.block_length = block_length;
    node->cond = cond;
    node->stmt = stmt;
    node->expr = expr;
    node->nclose = UINT32_MAX;
    return (gnode_t *)node;
}